

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *this_00;
  reference ppcVar5;
  mapped_type *__x;
  size_type sVar6;
  ostream *poVar7;
  string *psVar8;
  pair<std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>,_bool> pVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_588 [32];
  undefined1 local_568 [8];
  ostringstream cmCPackLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  char *local_3d0;
  char *option_3;
  undefined1 local_3a8 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_229;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  char *local_1e8;
  char *option_2;
  undefined1 local_1d8;
  cmCPackComponent *local_1d0;
  cmCPackComponent *dep;
  iterator __end2;
  iterator __begin2;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range2;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char *local_168;
  char *option_1;
  char *local_140;
  char *option;
  string local_130;
  char *local_110;
  char *optPACKAGE_VERSION;
  char *local_e8;
  char *optVERSION;
  key_type local_d8;
  allocator<char> local_b1;
  key_type local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string prefix;
  cmCPackComponent *component_local;
  cmCPackIFWPackage *this_local;
  
  if (component == (cmCPackComponent *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    prefix.field_2._8_8_ = component;
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_80,(string *)prefix.field_2._8_8_);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_",&local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar3,psVar8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)((long)&optVERSION + 7));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar3,psVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optVERSION + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &optPACKAGE_VERSION,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "VERSION");
    pcVar4 = cmCPackIFWCommon::GetOption
                       (&this->super_cmCPackIFWCommon,(string *)&optPACKAGE_VERSION);
    std::__cxx11::string::~string((string *)&optPACKAGE_VERSION);
    local_e8 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"CPACK_PACKAGE_VERSION",(allocator<char> *)((long)&option + 7)
                );
      pcVar4 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
      local_110 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
      }
      else {
        std::__cxx11::string::operator=((string *)&this->Version,pcVar4);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Version,pcVar4);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "SCRIPT");
    pcVar4 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&option_1);
    std::__cxx11::string::~string((string *)&option_1);
    local_140 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Script,pcVar4);
    }
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "USER_INTERFACES");
    pcVar4 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    local_168 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      pcVar4 = local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar4,(allocator<char> *)((long)&__range2 + 7));
      cmSystemTools::ExpandListArgument(&local_1a8,&this->UserInterfaces,false);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    }
    bVar2 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::empty
                      ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                       (prefix.field_2._8_8_ + 200));
    if (!bVar2) {
      this_00 = (vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                (prefix.field_2._8_8_ + 200);
      __end2 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin(this_00);
      dep = (cmCPackComponent *)
            std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                         *)&dep), bVar2) {
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                  ::operator*(&__end2);
        local_1d0 = *ppcVar5;
        __x = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&((this->super_cmCPackIFWCommon).Generator)->ComponentPackages,&local_1d0
                          );
        pVar9 = std::
                set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
                ::insert(&this->Dependencies,__x);
        option_2 = (char *)pVar9.first._M_node;
        local_1d8 = pVar9.second;
        __gnu_cxx::
        __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
        ::operator++(&__end2);
      }
    }
    std::operator+(&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "LICENSES");
    pcVar4 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    local_1e8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Licenses);
      pcVar4 = local_1e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar4,&local_229);
      cmSystemTools::ExpandListArgument(&local_228,&this->Licenses,false);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Licenses);
      if ((sVar6 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
        poVar7 = std::operator<<((ostream *)local_3a8,(string *)local_40);
        poVar7 = std::operator<<(poVar7,"LICENSES");
        poVar7 = std::operator<<(poVar7," should contain pairs of <display_name> and <file_path>.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
          pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0xda,pcVar4);
          std::__cxx11::string::~string((string *)&option_3);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->Licenses);
      }
    }
    std::operator+(&local_3f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "PRIORITY");
    pcVar4 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    local_3d0 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->SortingPriority,pcVar4);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
      poVar7 = std::operator<<((ostream *)local_568,"The \"PRIORITY\" option is set ");
      poVar7 = std::operator<<(poVar7,"for component \"");
      poVar7 = std::operator<<(poVar7,(string *)prefix.field_2._8_8_);
      poVar7 = std::operator<<(poVar7,"\", but there option is ");
      poVar7 = std::operator<<(poVar7,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0xe7,pcVar4);
        std::__cxx11::string::~string(local_588);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
    }
    pcVar4 = "true";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 2 & 1) != 0) {
      pcVar4 = "false";
    }
    std::__cxx11::string::operator=((string *)&this->Default,pcVar4);
    std::operator+(&local_5a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "ESSENTIAL");
    bVar2 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_5a8);
    std::__cxx11::string::~string((string *)&local_5a8);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->Essential,"true");
    }
    pcVar4 = "";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 1 & 1) != 0) {
      pcVar4 = "true";
    }
    std::__cxx11::string::operator=((string *)&this->Virtual,pcVar4);
    pcVar4 = "false";
    if ((*(byte *)(prefix.field_2._8_8_ + 0x48) & 1) != 0) {
      pcVar4 = "true";
    }
    std::__cxx11::string::operator=((string *)&this->ForcedInstallation,pcVar4);
    this_local._4_4_ = ConfigureFromPrefix(this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent* component)
{
  if (!component) {
    return 0;
  }

  // Restore default configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";

  // Display name
  this->DisplayName[""] = component->DisplayName;

  // Description
  this->Description[""] = component->Description;

  // Version
  if (const char* optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = optVERSION;
  } else if (const char* optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (const char* option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = option;
  }

  // User interfaces
  if (const char* option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmSystemTools::ExpandListArgument(option, this->UserInterfaces);
  }

  // CMake dependencies
  if (!component->Dependencies.empty()) {
    for (cmCPackComponent* dep : component->Dependencies) {
      this->Dependencies.insert(this->Generator->ComponentPackages[dep]);
    }
  }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmSystemTools::ExpandListArgument(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (const char* option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = option;
    cmCPackIFWLogger(
      WARNING,
      "The \"PRIORITY\" option is set "
        << "for component \"" << component->Name << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  // Default
  this->Default = component->IsDisabledByDefault ? "false" : "true";

  // Essential
  if (this->IsOn(prefix + "ESSENTIAL")) {
    this->Essential = "true";
  }

  // Virtual
  this->Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  this->ForcedInstallation = component->IsRequired ? "true" : "false";

  return this->ConfigureFromPrefix(prefix);
}